

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementStyle.cpp
# Opt level: O2

float Rml::ComputeLength(NumericValue value,Element *element)

{
  Vector2f vp_dimensions;
  Context *pCVar1;
  ComputedValues *pCVar2;
  Vector2i VVar3;
  ElementDocument *this;
  Unit UVar4;
  float fVar5;
  float fVar6;
  float document_font_size;
  float fVar7;
  float local_1c;
  
  local_1c = 1.0;
  UVar4 = value.unit;
  if (((ulong)value >> 0x20 & 0x3e080) != 0) {
    pCVar1 = Element::GetContext(element);
    if (pCVar1 != (Context *)0x0) {
      local_1c = Context::GetDensityIndependentPixelRatio(pCVar1);
    }
  }
  fVar5 = 0.0;
  if ((UVar4 == VW) || (UVar4 == VH)) {
    pCVar1 = Element::GetContext(element);
    if (pCVar1 != (Context *)0x0) {
      VVar3 = Context::GetDimensions(pCVar1);
      fVar7 = (float)VVar3.x;
      fVar6 = (float)VVar3.y;
      document_font_size = 0.0;
      fVar5 = 0.0;
      goto LAB_002942f9;
    }
    document_font_size = 0.0;
  }
  else {
    if (UVar4 != REM) {
      if (UVar4 == EM) {
        pCVar2 = Element::GetComputedValues(element);
        fVar5 = (pCVar2->inherited).font_size;
      }
      fVar6 = 1.0;
      fVar7 = 1.0;
      document_font_size = 0.0;
      goto LAB_002942f9;
    }
    this = Element::GetOwnerDocument(element);
    if (this == (ElementDocument *)0x0) {
      pCVar2 = DefaultComputedValues();
    }
    else {
      pCVar2 = Element::GetComputedValues(&this->super_Element);
    }
    document_font_size = (pCVar2->inherited).font_size;
  }
  fVar5 = 0.0;
  fVar7 = 1.0;
  fVar6 = 1.0;
LAB_002942f9:
  vp_dimensions.y = fVar6;
  vp_dimensions.x = fVar7;
  fVar5 = ComputeLength(value,fVar5,document_font_size,local_1c,vp_dimensions);
  return fVar5;
}

Assistant:

static float ComputeLength(NumericValue value, Element* element)
{
	float font_size = 0.f;
	float doc_font_size = 0.f;
	float dp_ratio = 1.0f;
	Vector2f vp_dimensions(1.0f);

	if (Any(value.unit & Unit::DP_SCALABLE_LENGTH))
	{
		if (Context* context = element->GetContext())
			dp_ratio = context->GetDensityIndependentPixelRatio();
	}

	switch (value.unit)
	{
	case Unit::EM: font_size = element->GetComputedValues().font_size(); break;
	case Unit::REM:
		if (ElementDocument* document = element->GetOwnerDocument())
			doc_font_size = document->GetComputedValues().font_size();
		else
			doc_font_size = DefaultComputedValues().font_size();
		break;
	case Unit::VW:
	case Unit::VH:
		if (Context* context = element->GetContext())
			vp_dimensions = Vector2f(context->GetDimensions());
		break;
	default: break;
	}

	const float result = ComputeLength(value, font_size, doc_font_size, dp_ratio, vp_dimensions);
	return result;
}